

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O1

void __thiscall n_e_s::core::Mos6502::adc_impl(Mos6502 *this,uint8_t addend)

{
  byte bVar1;
  CpuRegisters *pCVar2;
  byte bVar3;
  uint uVar4;
  undefined3 in_register_00000031;
  
  pCVar2 = this->registers_;
  bVar1 = pCVar2->a;
  uVar4 = (pCVar2->p & 1) + (uint)bVar1 + CONCAT31(in_register_00000031,addend);
  bVar3 = (byte)uVar4;
  pCVar2->a = bVar3;
  pCVar2->p = (byte)((bVar3 ^ addend) & (bVar1 ^ bVar3)) >> 1 & 0x40 |
              bVar3 & 0x80 | (bVar3 == 0) * '\x02' | pCVar2->p & 0x3c | 0xff < uVar4;
  return;
}

Assistant:

void Mos6502::adc_impl(const uint8_t addend) {
    const uint8_t a_before = registers_->a;
    const uint8_t carry = registers_->p & C_FLAG ? static_cast<uint8_t>(1u)
                                                 : static_cast<uint8_t>(0u);
    const uint16_t temp_result = registers_->a + addend + carry;
    registers_->a = static_cast<uint8_t>(temp_result);

    set_carry(temp_result > 0xFF);
    set_zero(registers_->a);
    set_negative(registers_->a);
    set_overflow(a_before, addend, temp_result);
}